

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_decode_tiles
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 p_data_size;
  OPJ_BOOL OVar2;
  opj_image_t *ptr;
  opj_image_t *p_output_image;
  OPJ_OFF_T OVar3;
  char *fmt;
  uint uVar4;
  int iVar5;
  uint local_60;
  OPJ_UINT32 l_current_tile_no;
  OPJ_BOOL l_go_on;
  OPJ_UINT32 l_data_size;
  opj_event_mgr_t *local_50;
  OPJ_UINT32 l_nb_comps;
  OPJ_INT32 l_tile_y1;
  OPJ_INT32 l_tile_x1;
  OPJ_INT32 l_tile_y0;
  OPJ_INT32 l_tile_x0;
  
  l_go_on = 1;
  ptr = (opj_image_t *)opj_malloc(1000);
  if (ptr == (opj_image_t *)0x0) {
    opj_event_msg(p_manager,1,"Not enough memory to decode tiles\n");
    return 0;
  }
  local_60 = 1000;
  iVar5 = 0;
  local_50 = p_manager;
  do {
    OVar2 = opj_j2k_read_tile_header
                      (p_j2k,&l_current_tile_no,&l_data_size,&l_tile_x0,&l_tile_y0,&l_tile_x1,
                       &l_tile_y1,&l_nb_comps,&l_go_on,p_stream,p_manager);
    p_data_size = l_data_size;
    p_output_image = ptr;
    if (OVar2 == 0) {
LAB_00114776:
      opj_free(p_output_image);
      return 0;
    }
    if (l_go_on == 0) {
LAB_00114734:
      opj_free(p_output_image);
      return 1;
    }
    if (local_60 < l_data_size) {
      p_output_image = (opj_image_t *)opj_realloc(ptr,(ulong)l_data_size);
      local_60 = p_data_size;
      if (p_output_image == (opj_image_t *)0x0) {
        opj_free(ptr);
        uVar4 = (p_j2k->m_cp).tw * (p_j2k->m_cp).th;
        fmt = "Not enough memory to decode tile %d/%d\n";
        p_manager = local_50;
        OVar1 = l_current_tile_no;
        goto LAB_001147af;
      }
    }
    p_manager = local_50;
    OVar1 = l_current_tile_no;
    OVar2 = opj_j2k_decode_tile(p_j2k,l_current_tile_no,(OPJ_BYTE *)p_output_image,p_data_size,
                                p_stream,local_50);
    if (OVar2 == 0) {
      opj_free(p_output_image);
      uVar4 = (p_j2k->m_cp).tw * (p_j2k->m_cp).th;
      fmt = "Failed to decode tile %d/%d\n";
LAB_001147af:
      opj_event_msg(p_manager,1,fmt,(ulong)(OVar1 + 1),(ulong)uVar4);
      return 0;
    }
    opj_event_msg(p_manager,4,"Tile %d/%d has been decoded.\n",(ulong)(OVar1 + 1),
                  (ulong)((p_j2k->m_cp).tw * (p_j2k->m_cp).th));
    OVar2 = opj_j2k_update_image_data
                      ((opj_tcd_t *)p_j2k->m_tcd->tcd_image->tiles->comps,
                       (OPJ_BYTE *)p_j2k->m_tcd->image,p_output_image);
    if (OVar2 == 0) goto LAB_00114776;
    opj_event_msg(p_manager,4,"Image data has been updated with tile %d.\n\n",(ulong)(OVar1 + 1));
    OVar3 = opj_stream_get_number_byte_left(p_stream);
    if (((OVar3 == 0) && ((p_j2k->m_specific_param).m_decoder.m_state == 0x40)) ||
       (iVar5 = iVar5 + 1, ptr = p_output_image, iVar5 == (p_j2k->m_cp).tw * (p_j2k->m_cp).th))
    goto LAB_00114734;
  } while( true );
}

Assistant:

static OPJ_BOOL opj_j2k_decode_tiles ( opj_j2k_t *p_j2k,
                                                            opj_stream_private_t *p_stream,
                                                            opj_event_mgr_t * p_manager)
{
        OPJ_BOOL l_go_on = OPJ_TRUE;
        OPJ_UINT32 l_current_tile_no;
        OPJ_UINT32 l_data_size,l_max_data_size;
        OPJ_INT32 l_tile_x0,l_tile_y0,l_tile_x1,l_tile_y1;
        OPJ_UINT32 l_nb_comps;
        OPJ_BYTE * l_current_data;
        OPJ_UINT32 nr_tiles = 0;

        l_current_data = (OPJ_BYTE*)opj_malloc(1000);
        if (! l_current_data) {
                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to decode tiles\n");
                return OPJ_FALSE;
        }
        l_max_data_size = 1000;

		for (;;) {
                if (! opj_j2k_read_tile_header( p_j2k,
                                        &l_current_tile_no,
                                        &l_data_size,
                                        &l_tile_x0, &l_tile_y0,
                                        &l_tile_x1, &l_tile_y1,
                                        &l_nb_comps,
                                        &l_go_on,
                                        p_stream,
                                        p_manager)) {
                        opj_free(l_current_data);
                        return OPJ_FALSE;
                }

                if (! l_go_on) {
                        break;
                }

                if (l_data_size > l_max_data_size) {
                        OPJ_BYTE *l_new_current_data = (OPJ_BYTE *) opj_realloc(l_current_data, l_data_size);
                        if (! l_new_current_data) {
                                opj_free(l_current_data);
                                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to decode tile %d/%d\n", l_current_tile_no +1, p_j2k->m_cp.th * p_j2k->m_cp.tw);
                                return OPJ_FALSE;
                        }
                        l_current_data = l_new_current_data;
                        l_max_data_size = l_data_size;
                }

                if (! opj_j2k_decode_tile(p_j2k,l_current_tile_no,l_current_data,l_data_size,p_stream,p_manager)) {
                        opj_free(l_current_data);
                        opj_event_msg(p_manager, EVT_ERROR, "Failed to decode tile %d/%d\n", l_current_tile_no +1, p_j2k->m_cp.th * p_j2k->m_cp.tw);
                        return OPJ_FALSE;
                }
                opj_event_msg(p_manager, EVT_INFO, "Tile %d/%d has been decoded.\n", l_current_tile_no +1, p_j2k->m_cp.th * p_j2k->m_cp.tw);

                if (! opj_j2k_update_image_data(p_j2k->m_tcd,l_current_data, p_j2k->m_output_image)) {
                        opj_free(l_current_data);
                        return OPJ_FALSE;
                }
                opj_event_msg(p_manager, EVT_INFO, "Image data has been updated with tile %d.\n\n", l_current_tile_no + 1);
                
                if(opj_stream_get_number_byte_left(p_stream) == 0  
                    && p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_NEOC)
                    break;
                if(++nr_tiles ==  p_j2k->m_cp.th * p_j2k->m_cp.tw) 
                    break;
        }

        opj_free(l_current_data);

        return OPJ_TRUE;
}